

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O0

int __thiscall ktxSupercompressor::main(ktxSupercompressor *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  ulong uVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *__new;
  long lVar9;
  long *in_RDI;
  stringstream writer;
  char answer;
  bool force;
  int fd_tmp;
  path outputPath;
  string infile;
  const_iterator it;
  string tmpfile;
  int exitCode;
  ktxTexture2 *texture;
  ktx_error_code_e result;
  FILE *outf;
  FILE *inf;
  string *in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  string *in_stack_fffffffffffffa18;
  ostream *in_stack_fffffffffffffa20;
  ostream *in_stack_fffffffffffffa28;
  ktxApp *in_stack_fffffffffffffa30;
  string_type *in_stack_fffffffffffffa38;
  path *in_stack_fffffffffffffa40;
  ostream *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  ktxTexture2 *in_stack_fffffffffffffa90;
  scApp *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  undefined8 in_stack_fffffffffffffb18;
  char **in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  ktxApp *in_stack_fffffffffffffb30;
  bool local_3fa;
  undefined1 local_3f9 [40];
  allocator<char> local_3d1;
  string local_3d0 [36];
  int local_3ac;
  string local_3a8 [32];
  string local_388 [32];
  stringstream local_368 [399];
  allocator<char> local_1d9;
  string local_1d8 [34];
  char local_1b6;
  byte local_1b5;
  int local_1b4;
  string local_1b0 [32];
  string local_190 [32];
  path local_170;
  string local_148 [32];
  string local_128 [79];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80 [3];
  string local_68 [36];
  int local_44;
  int *local_40;
  int local_34;
  FILE *local_30;
  FILE *local_28;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  local_30 = (FILE *)0x0;
  local_40 = (int *)0x0;
  local_44 = 0;
  std::__cxx11::string::string(local_68);
  ktxApp::processCommandLine
            (in_stack_fffffffffffffb30,iVar2,in_stack_fffffffffffffb20,
             (StdinUse)((ulong)in_stack_fffffffffffffb18 >> 0x20),
             (OutfilePos)in_stack_fffffffffffffb18);
  (**(code **)(*in_RDI + 0x20))();
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(local_80);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa08);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffa08);
  local_80[0]._M_current = local_88;
  do {
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa08);
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffa08);
    if (!bVar1) {
      local_4 = 0;
      local_3ac = 1;
LAB_0010b9a2:
      std::__cxx11::string::~string(local_68);
      return local_4;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_80);
    std::__cxx11::string::string(local_b8,(string *)pbVar3);
    iVar2 = std::__cxx11::string::compare((char *)local_b8);
    if (iVar2 == 0) {
      local_28 = _stdin;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)in_stack_fffffffffffffa40);
      local_28 = (FILE *)fopenUTF8((string *)
                                   CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                                   in_stack_fffffffffffffa08);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    if (local_28 == (FILE *)0x0) {
      in_stack_fffffffffffffa40 =
           (path *)std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
      in_stack_fffffffffffffa38 =
           (string_type *)
           std::operator<<((ostream *)in_stack_fffffffffffffa40," could not open input file \"");
      iVar2 = std::__cxx11::string::compare((char *)local_b8);
      if (iVar2 != 0) {
        std::__cxx11::string::string((string *)(local_3f9 + 1),local_b8);
      }
      else {
        in_stack_fffffffffffffa30 = (ktxApp *)local_3f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                   (allocator<char> *)in_stack_fffffffffffffa40);
      }
      local_3fa = iVar2 == 0;
      in_stack_fffffffffffffa28 =
           std::operator<<((ostream *)in_stack_fffffffffffffa38,(string *)(local_3f9 + 1));
      in_stack_fffffffffffffa20 = std::operator<<(in_stack_fffffffffffffa28,"\". ");
      piVar5 = __errno_location();
      pcVar7 = strerror(*piVar5);
      in_stack_fffffffffffffa18 = (string *)std::operator<<(in_stack_fffffffffffffa20,pcVar7);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffa18,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)(local_3f9 + 1));
      if (local_3fa) {
        std::allocator<char>::~allocator((allocator<char> *)local_3f9);
      }
      local_44 = 2;
      local_3ac = 5;
    }
    else {
      if ((*(byte *)(in_RDI + 0x51) & 1) == 0) {
        lVar9 = std::__cxx11::string::length();
        if (lVar9 == 0) {
          dir_name(in_stack_fffffffffffffa18);
          std::operator+(in_stack_fffffffffffffa18,
                         (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          std::__cxx11::string::operator=(local_68,local_190);
          std::__cxx11::string::~string(local_190);
          std::__cxx11::string::~string(local_1b0);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
          local_1b4 = mkstemp(pcVar7);
          local_30 = fdopen(local_1b4,"wb");
        }
        else {
          std::__cxx11::string::string(local_148,(string *)(in_RDI + 0x1b));
          DecodeUTF8Path(in_stack_fffffffffffffa08);
          std::filesystem::__cxx11::path::path
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                     (format)((ulong)in_stack_fffffffffffffa30 >> 0x38));
          std::__cxx11::string::~string(local_128);
          std::__cxx11::string::~string(local_148);
          uVar4 = std::filesystem::__cxx11::path::has_parent_path();
          if ((uVar4 & 1) != 0) {
            std::filesystem::__cxx11::path::parent_path();
            std::filesystem::create_directories(&local_170);
            std::filesystem::__cxx11::path::~path
                      ((path *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
          }
          local_30 = (FILE *)ktxApp::fopen_write_if_not_exists
                                       ((string *)
                                        CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0
                                                ));
          std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10));
        }
      }
      else {
        local_30 = _stdout;
      }
      if ((local_30 == (FILE *)0x0) && (piVar5 = __errno_location(), *piVar5 == 0x11)) {
        local_1b5 = *(byte *)((long)in_RDI + 0x289) & 1;
        if (local_1b5 == 0) {
          iVar2 = fileno(_stdin);
          iVar2 = isatty(iVar2);
          if (iVar2 != 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Output file ");
            poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x1b));
            std::operator<<(poVar6," exists. Overwrite? [Y or n] ");
            std::operator>>((istream *)&std::cin,&local_1b6);
            if (local_1b6 == 'Y') {
              local_1b5 = 1;
            }
          }
        }
        if ((local_1b5 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                     (allocator<char> *)in_stack_fffffffffffffa40);
          local_30 = (FILE *)fopenUTF8((string *)
                                       CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10)
                                       ,in_stack_fffffffffffffa08);
          std::__cxx11::string::~string(local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
        }
      }
      if (local_30 == (FILE *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
        poVar6 = std::operator<<(poVar6," could not open output file \"");
        local_3f9[0x27] = 0;
        if ((*(byte *)(in_RDI + 0x51) & 1) == 0) {
          std::__cxx11::string::string(local_3d0,(string *)(in_RDI + 0x1b));
        }
        else {
          std::allocator<char>::allocator();
          local_3f9[0x27] = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                     (allocator<char> *)in_stack_fffffffffffffa40);
        }
        poVar6 = std::operator<<(poVar6,local_3d0);
        in_stack_fffffffffffffa50 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(poVar6,"\". ");
        piVar5 = __errno_location();
        pcVar7 = strerror(*piVar5);
        in_stack_fffffffffffffa48 = std::operator<<((ostream *)in_stack_fffffffffffffa50,pcVar7);
        std::ostream::operator<<
                  ((ostream *)in_stack_fffffffffffffa48,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_3d0);
        if ((local_3f9[0x27] & 1) != 0) {
          std::allocator<char>::~allocator(&local_3d1);
        }
        local_44 = 2;
        local_3ac = 5;
      }
      else {
        local_34 = ktxTexture2_CreateFromStdioStream(local_28,1,&local_40);
        if (local_34 == 0xf) {
          poVar6 = std::operator<<((ostream *)&std::cerr,local_b8);
          poVar6 = std::operator<<(poVar6," is not a KTX v2 file.");
          std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
          local_44 = 2;
          local_3ac = 5;
        }
        else if (local_34 == 0) {
          fclose(local_28);
          if (*local_40 == 2) {
            if (local_40[0x22] == 0) {
              if (((((int)in_RDI[0x22] == 0) && ((int)in_RDI[0x21] == 0)) &&
                  ((*(byte *)((long)in_RDI + 0x15c) & 1) == 0)) ||
                 ((*(byte *)((long)local_40 + 0x22) & 1) == 0)) {
                std::__cxx11::stringstream::stringstream(local_368);
                ktxApp::writeId(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                                SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
                ktxHashList_DeleteKVPair(local_40 + 0x14,"KTXwriter");
                piVar5 = local_40 + 0x14;
                std::__cxx11::stringstream::str();
                iVar2 = std::__cxx11::string::length();
                std::__cxx11::stringstream::str();
                uVar8 = std::__cxx11::string::c_str();
                ktxHashList_AddKVPair(piVar5,"KTXwriter",iVar2 + 1,uVar8);
                std::__cxx11::string::~string(local_3a8);
                std::__cxx11::string::~string(local_388);
                local_44 = scApp::encode(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                                         in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
                if (local_44 == 0) {
                  in_stack_fffffffffffffae4 =
                       (**(code **)(*(long *)(local_40 + 2) + 0x58))(local_40,local_30);
                  local_34 = in_stack_fffffffffffffae4;
                  if (in_stack_fffffffffffffae4 == 0) {
                    fclose(local_30);
                    lVar9 = std::__cxx11::string::length();
                    if ((lVar9 == 0) && ((*(byte *)(in_RDI + 0x51) & 1) == 0)) {
                      lVar9 = std::__cxx11::string::size();
                      bVar1 = false;
                      if (lVar9 != 0) {
                        lVar9 = std::__cxx11::string::length();
                        bVar1 = lVar9 != 0;
                      }
                      if (!bVar1) {
                        __assert_fail("tmpfile.size() > 0 && infile.length()",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktxsc/ktxsc.cpp"
                                      ,300,"virtual int ktxSupercompressor::main(int, char **)");
                      }
                      pcVar7 = (char *)std::__cxx11::string::c_str();
                      __new = (char *)std::__cxx11::string::c_str();
                      iVar2 = rename(pcVar7,__new);
                      if (iVar2 != 0) {
                        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
                        poVar6 = std::operator<<(poVar6,": rename of \"");
                        in_stack_fffffffffffffa98 = (scApp *)std::operator<<(poVar6,local_68);
                        in_stack_fffffffffffffa90 =
                             (ktxTexture2 *)
                             std::operator<<((ostream *)in_stack_fffffffffffffa98,"\" to \"");
                        in_stack_fffffffffffffa88 =
                             (string *)
                             std::operator<<((ostream *)in_stack_fffffffffffffa90,local_b8);
                        in_stack_fffffffffffffa80 =
                             (string *)
                             std::operator<<((ostream *)in_stack_fffffffffffffa88,"\" failed: ");
                        piVar5 = __errno_location();
                        pcVar7 = strerror(*piVar5);
                        poVar6 = std::operator<<((ostream *)in_stack_fffffffffffffa80,pcVar7);
                        std::ostream::operator<<
                                  ((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
                        local_44 = 2;
                        local_3ac = 5;
                        goto LAB_0010b519;
                      }
                    }
                    local_3ac = 0;
                  }
                  else {
                    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
                    poVar6 = std::operator<<(poVar6," failed to write KTX file; ");
                    pcVar7 = (char *)ktxErrorString(local_34);
                    poVar6 = std::operator<<(poVar6,pcVar7);
                    std::ostream::operator<<
                              ((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
                    local_44 = 2;
                    local_3ac = 5;
                  }
                }
                else {
                  local_3ac = 5;
                }
LAB_0010b519:
                std::__cxx11::stringstream::~stringstream(local_368);
                if (local_3ac == 0) {
                  local_3ac = 0;
                }
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
                poVar6 = std::operator<<(poVar6,": ");
                poVar6 = std::operator<<(poVar6,"Cannot encode already block-compressed textures ");
                poVar6 = std::operator<<(poVar6,"to ASTC, Basis Universal or UASTC.");
                std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
                local_44 = 1;
                local_3ac = 5;
              }
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
              poVar6 = std::operator<<(poVar6,": ");
              poVar6 = std::operator<<(poVar6,"Cannot supercompress already supercompressed files.")
              ;
              std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
              local_44 = 1;
              local_3ac = 5;
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
            poVar6 = std::operator<<(poVar6,": ");
            poVar6 = std::operator<<(poVar6,
                                     "Only KTX texture version 2 files can be supercompressed.");
            std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
            local_44 = 1;
            local_3ac = 5;
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 1));
          poVar6 = std::operator<<(poVar6," failed to create ktxTexture from ");
          poVar6 = std::operator<<(poVar6,local_b8);
          poVar6 = std::operator<<(poVar6,": ");
          pcVar7 = (char *)ktxErrorString(local_34);
          poVar6 = std::operator<<(poVar6,pcVar7);
          std::ostream::operator<<((ostream *)poVar6,std::endl<char,std::char_traits<char>>);
          local_44 = 2;
          local_3ac = 5;
        }
      }
    }
    std::__cxx11::string::~string(local_b8);
    if (local_3ac != 0) {
      if (local_3ac == 5) {
        if (local_30 != (FILE *)0x0) {
          fclose(local_30);
        }
        lVar9 = std::__cxx11::string::size();
        if (lVar9 != 0) {
          unlinkUTF8((string *)0x10b94f);
        }
        lVar9 = std::__cxx11::string::length();
        if (lVar9 != 0) {
          unlinkUTF8((string *)0x10b985);
        }
        local_4 = local_44;
        local_3ac = 1;
      }
      goto LAB_0010b9a2;
    }
    in_stack_fffffffffffffa14 = local_3ac;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffa18,0);
  } while( true );
}

Assistant:

int
ktxSupercompressor::main(int argc, char* argv[])
{
    FILE *inf, *outf = nullptr;
    KTX_error_code result;
    ktxTexture2* texture = 0;
    int exitCode = 0;
    string tmpfile;

    processCommandLine(argc, argv, eAllowStdin);
    validateOptions();

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
        string infile = *it;

        if (infile.compare("-") == 0) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            if (options.useStdout) {
                outf = stdout;
#if defined(_WIN32)
                /* Set "stdout" to have binary mode */
                (void)_setmode( _fileno( stdout ), _O_BINARY );
#endif
            } else if (options.outfile.length()) {
                const auto outputPath = filesystem::path(DecodeUTF8Path(options.outfile));
                if (outputPath.has_parent_path())
                    filesystem::create_directories(outputPath.parent_path());
                outf = fopen_write_if_not_exists(options.outfile);
            } else {
                // Make a temporary file in the same directory as the source
                // file to avoid cross-device rename issues later.
                tmpfile = dir_name(infile) + "ktxsc.tmp.XXXXXX";
#if defined(_WIN32)
                // Despite receiving size() the debug CRT version of mktemp_s
                // asserts that the string template is NUL terminated.
                tmpfile.push_back('\0');
                if (_wmktemp_s(&DecodeUTF8Path(tmpfile)[0], tmpfile.size()) == 0)
                    outf = fopenUTF8(tmpfile, "wb");
#else
                int fd_tmp = mkstemp(&tmpfile[0]);
                outf = fdopen(fd_tmp, "wb");
#endif
            }

            if (!outf && errno == EEXIST) {
                bool force = options.force;
                if (!force) {
                    if (isatty(fileno(stdin))) {
                        char answer;
                        cout << "Output file " << options.outfile
                             << " exists. Overwrite? [Y or n] ";
                        cin >> answer;
                        if (answer == 'Y') {
                            force = true;
                        }
                    }
                }
                if (force) {
                    outf = fopenUTF8(options.outfile, "wb");
                }
            }

            if (outf) {
                result = ktxTexture2_CreateFromStdioStream(inf,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture);
                if (result == KTX_UNKNOWN_FILE_FORMAT) {
                    cerr << infile << " is not a KTX v2 file." << endl;
                    exitCode = 2;
                    goto cleanup;
                } else if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to create ktxTexture from " << infile
                         << ": " << ktxErrorString(result) << endl;
                    exitCode = 2;
                    goto cleanup;
                }
                (void)fclose(inf);

                if (texture->classId != ktxTexture2_c) {
                    cerr << name << ": "
                         << "Only KTX texture version 2 files can be supercompressed."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }
                if (texture->supercompressionScheme != KTX_SS_NONE) {
                    cerr << name << ": "
                         << "Cannot supercompress already supercompressed files."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }
                if ((options.astc || options.etc1s || options.bopts.uastc) && texture->isCompressed) {
                    cerr << name << ": "
                         << "Cannot encode already block-compressed textures "
                         << "to ASTC, Basis Universal or UASTC."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }

                // Modify the writer metadata.
                stringstream writer;
                writeId(writer, true);
                ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_KEY);
                ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                      (ktx_uint32_t)writer.str().length() + 1,
                                      writer.str().c_str());

                exitCode = encode(texture, options.inputSwizzle, infile);
                if (exitCode)
                    goto cleanup;
                result = ktxTexture_WriteToStdioStream(ktxTexture(texture), outf);
                if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to write KTX file; "
                         << ktxErrorString(result) << endl;
                    exitCode = 2;
                    goto cleanup;
                }
                (void)fclose(outf);
                if (!options.outfile.length() && !options.useStdout) {
                    // Move the new file over the original.
                    assert(tmpfile.size() > 0 && infile.length());
#if defined(_WIN32)
                    // Windows' rename() fails if the destination file exists!
                    if (!MoveFileExW(DecodeUTF8Path(tmpfile).c_str(), DecodeUTF8Path(infile).c_str(),
                                     MOVEFILE_REPLACE_EXISTING))
#else
                    if (rename(tmpfile.c_str(), infile.c_str()))
#endif
                    {
                        cerr << name
                             << ": rename of \"" << tmpfile << "\" to \""
                             << infile << "\" failed: "
                             << strerror(errno) << endl;
                        exitCode = 2;
                        goto cleanup;
                    }
                }
            } else {
                cerr << name
                     << " could not open output file \""
                     << (options.useStdout ? "stdout" : options.outfile) << "\". "
                     << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") == 0 ? "stdin" : infile) << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }
    return 0;

cleanup:
    if (outf) { // Windows debug CRT fclose asserts that outf != nullptr...
        (void)fclose(outf); // N.B Windows refuses to unlink an open file.
    }
    if (tmpfile.size() > 0) (void)unlinkUTF8(tmpfile);
    if (options.outfile.length()) (void)unlinkUTF8(options.outfile);
    return exitCode;
}